

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_wcscpy_s(wchar_t *dst,size_t dstCap,wchar_t *src)

{
  bool bVar1;
  size_t i;
  wchar_t *src_local;
  size_t dstCap_local;
  wchar_t *dst_local;
  int local_4;
  
  if (dst == (wchar_t *)0x0) {
    local_4 = 0x16;
  }
  else if (dstCap == 0) {
    local_4 = 0x22;
  }
  else if (src == (wchar_t *)0x0) {
    *dst = L'\0';
    local_4 = 0x16;
  }
  else {
    i = 0;
    while( true ) {
      bVar1 = false;
      if (i < dstCap) {
        bVar1 = src[i] != L'\0';
      }
      if (!bVar1) break;
      dst[i] = src[i];
      i = i + 1;
    }
    if (i < dstCap) {
      dst[i] = L'\0';
      local_4 = 0;
    }
    else {
      *dst = L'\0';
      local_4 = 0x22;
    }
  }
  return local_4;
}

Assistant:

MA_API MA_NO_INLINE int ma_wcscpy_s(wchar_t* dst, size_t dstCap, const wchar_t* src)
{
    size_t i;

    if (dst == 0) {
        return 22;
    }
    if (dstCap == 0) {
        return 34;
    }
    if (src == 0) {
        dst[0] = '\0';
        return 22;
    }

    for (i = 0; i < dstCap && src[i] != '\0'; ++i) {
        dst[i] = src[i];
    }

    if (i < dstCap) {
        dst[i] = '\0';
        return 0;
    }

    dst[0] = '\0';
    return 34;
}